

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

Variable * parse_variable(Variable *__return_storage_ptr__,string *var)

{
  long lVar1;
  runtime_error *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string type;
  string name;
  
  lVar1 = std::__cxx11::string::rfind((char)var,0x3a);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&type,(ulong)var);
    std::__cxx11::string::substr((ulong)&name,(ulong)var);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&name);
    std::__cxx11::string::string((string *)&__return_storage_ptr__->type,(string *)&type);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&type);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  name._M_dataplus._M_p = (var->_M_dataplus)._M_p;
  name._M_string_length = var->_M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x25;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&name;
  ::fmt::v8::vformat_abi_cxx11_(&type,(v8 *)"Couldn\'t find type of variable in {}\n",fmt,args);
  std::runtime_error::runtime_error(this,(string *)&type);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable parse_variable(const std::string& var)
{
    // parse the variable
    size_t colon = var.rfind(':');
    if (colon == std::string::npos)
        throw std::runtime_error(fmt::format("Couldn't find type of variable in {}\n", var));

    std::string type = var.substr(colon+1);
    std::string name = var.substr(0,colon);

    Variable v = { name, type };
    return v;
}